

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderLimitsRenderingBase::GeometryShaderLimitsRenderingBase
          (GeometryShaderLimitsRenderingBase *this,Context *context,ExtParameters *extParams,
          char *name,char *description)

{
  char *description_local;
  char *name_local;
  ExtParameters *extParams_local;
  Context *context_local;
  GeometryShaderLimitsRenderingBase *this_local;
  
  TestCaseBase::TestCaseBase(&this->super_TestCaseBase,context,extParams,name,description);
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GeometryShaderLimitsRenderingBase_0325f938;
  this->m_fragment_shader_id = 0;
  this->m_geometry_shader_id = 0;
  this->m_program_object_id = 0;
  this->m_vertex_shader_id = 0;
  this->m_framebuffer_object_id = 0;
  this->m_color_texture_id = 0;
  this->m_vertex_array_object_id = 0;
  this->m_fragment_shader_parts = (GLchar **)0x0;
  this->m_geometry_shader_parts = (GLchar **)0x0;
  this->m_vertex_shader_parts = (GLchar **)0x0;
  this->m_n_fragment_shader_parts = 0;
  this->m_n_geometry_shader_parts = 0;
  this->m_n_vertex_shader_parts = 0;
  this->m_texture_format = 0x8058;
  this->m_texture_height = 0;
  this->m_texture_pixel_size = 0;
  this->m_texture_read_format = 0x1908;
  this->m_texture_read_type = 0x1401;
  this->m_texture_width = 0;
  return;
}

Assistant:

GeometryShaderLimitsRenderingBase::GeometryShaderLimitsRenderingBase(Context& context, const ExtParameters& extParams,
																	 const char* name, const char* description)
	: TestCaseBase(context, extParams, name, description)
	, m_fragment_shader_id(0)
	, m_geometry_shader_id(0)
	, m_program_object_id(0)
	, m_vertex_shader_id(0)
	, m_framebuffer_object_id(0)
	, m_color_texture_id(0)
	, m_vertex_array_object_id(0)
	, m_fragment_shader_parts(0)
	, m_geometry_shader_parts(0)
	, m_vertex_shader_parts(0)
	, m_n_fragment_shader_parts(0)
	, m_n_geometry_shader_parts(0)
	, m_n_vertex_shader_parts(0)
	, m_texture_format(GL_RGBA8)
	, m_texture_height(0)
	, m_texture_pixel_size(0)
	, m_texture_read_format(GL_RGBA)
	, m_texture_read_type(GL_UNSIGNED_BYTE)
	, m_texture_width(0)
{
	/* Nothing to be done here */
}